

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

errr Term_xtra_x11(wchar_t n,wchar_t v)

{
  uint8_t uVar1;
  uint8_t blue;
  void *pvVar2;
  undefined8 *puVar3;
  ulong uVar4;
  errr eVar5;
  uint32_t uVar6;
  ulong fg;
  long lVar7;
  uint8_t red;
  int iVar8;
  long lVar9;
  _Bool wait;
  undefined1 local_a0 [8];
  ulong local_98;
  
  eVar5 = 1;
  switch(n) {
  case L'\x01':
    wait = v != L'\0';
    goto LAB_00124efa;
  case L'\x02':
    do {
      eVar5 = CheckEvent(false);
    } while (eVar5 == 0);
    return 0;
  case L'\x03':
    XClearWindow(metadpy_default_0,Infowin->win);
    break;
  default:
    goto switchD_00124ed1_caseD_4;
  case L'\x06':
    XFlush(metadpy_default_0);
    break;
  case L'\a':
    XBell(metadpy_default_0,100);
    break;
  case L'\t':
    wait = false;
LAB_00124efa:
    eVar5 = CheckEvent(wait);
    return eVar5;
  case L'\n':
    if ((metadpy_default_16 & 2) == 0) {
      return 0;
    }
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
      if (color_table_x11[lVar9][0] == angband_color_table[lVar9][0]) {
        uVar1 = color_table_x11[lVar9][1];
        red = angband_color_table[lVar9][1];
        if (((uVar1 != angband_color_table[lVar9][1]) ||
            (red = uVar1, color_table_x11[lVar9][2] != angband_color_table[lVar9][2])) ||
           (color_table_x11[lVar9][3] != angband_color_table[lVar9][3])) goto LAB_00124f91;
      }
      else {
        red = angband_color_table[lVar9][1];
LAB_00124f91:
        color_table_x11[lVar9][0] = angband_color_table[lVar9][0];
        color_table_x11[lVar9][1] = red;
        uVar1 = angband_color_table[lVar9][2];
        color_table_x11[lVar9][2] = uVar1;
        blue = angband_color_table[lVar9][3];
        color_table_x11[lVar9][3] = blue;
        uVar6 = create_pixel(metadpy_default_0,red,uVar1,blue);
        fg = (ulong)uVar6;
        Infoclr = clr[lVar9];
        Infoclr_change_fg(fg);
        iVar8 = (int)lVar9;
        if (iVar8 == 0) {
          metadpy_default_13 = fg;
          for (lVar7 = 0; uVar4 = metadpy_default_14, lVar7 != 0x100; lVar7 = lVar7 + 8) {
            Infoclr = *(infoclr **)((long)clr + lVar7);
            Infoclr_change_bg(fg);
          }
        }
        else {
          uVar4 = fg;
          if ((iVar8 != 1) && (uVar4 = metadpy_default_14, iVar8 == 0x1c)) {
            for (lVar7 = 0; uVar4 = metadpy_default_14, lVar7 != 0x20; lVar7 = lVar7 + 1) {
              Infoclr = clr[lVar7 + 0x40];
              Infoclr_change_bg(fg);
            }
          }
        }
        metadpy_default_14 = uVar4;
        Infoclr = clr[lVar9 + 0x20];
        Infoclr_change_fg(fg);
        Infoclr_change_bg(fg);
        Infoclr = clr[lVar9 + 0x40];
        Infoclr_change_fg(fg);
      }
    }
    local_98 = metadpy_default_13;
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      if (((angband_term[lVar9] != (term *)0x0) &&
          (pvVar2 = angband_term[lVar9]->data, pvVar2 != (void *)0x0)) &&
         (puVar3 = *(undefined8 **)((long)pvVar2 + 0xe0), puVar3 != (undefined8 *)0x0)) {
        XChangeWindowAttributes(metadpy_default_0,*puVar3,2,local_a0);
      }
    }
    break;
  case L'\f':
    if (v == L'\0') {
      return 0;
    }
    Infowin = *(infowin **)((long)Term->data + 0xe0);
    Infofnt = *(infofnt **)((long)Term->data + 0xd8);
    return 0;
  case L'\r':
    eVar5 = 0;
    if (L'\0' < v) {
      usleep(v * 1000);
    }
    goto switchD_00124ed1_caseD_4;
  }
  eVar5 = 0;
switchD_00124ed1_caseD_4:
  return eVar5;
}

Assistant:

static errr Term_xtra_x11(int n, int v)
{
	/* Handle a subset of the legal requests */
	switch (n)
	{
		/* Make a noise */
		case TERM_XTRA_NOISE: Metadpy_do_beep(); return (0);

		/* Flush the output XXX XXX */
		case TERM_XTRA_FRESH: Metadpy_update(1, 0, 0); return (0);

		/* Process random events XXX */
		case TERM_XTRA_BORED: return (CheckEvent(0));

		/* Process Events XXX */
		case TERM_XTRA_EVENT: return (CheckEvent(v));

		/* Flush the events XXX */
		case TERM_XTRA_FLUSH: while (!CheckEvent(false)); return (0);

		/* Handle change in the "level" */
		case TERM_XTRA_LEVEL: return (Term_xtra_x11_level(v));

		/* Clear the screen */
		case TERM_XTRA_CLEAR: Infowin_wipe(); return (0);

		/* Delay for some milliseconds */
		case TERM_XTRA_DELAY:
			if (v > 0) usleep(1000 * v);
			return (0);

		/* React to changes */
		case TERM_XTRA_REACT: return (Term_xtra_x11_react());
	}

	/* Unknown */
	return (1);
}